

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeInitializationTest.cpp
# Opt level: O2

EStatusCode
ShowFaceProperties(FreeTypeWrapper *inFreeType,string *inFontFilePath,
                  string *inSecondaryFontFilePath)

{
  FT_UShort FVar1;
  FT_Error FVar2;
  BoolAndFTShort BVar3;
  BoolAndFTShort BVar4;
  EFontStretch EVar5;
  FT_UInt glyph_index;
  FT_Face inFace;
  ostream *poVar6;
  FT_Face pFVar7;
  char *pcVar8;
  EStatusCode EVar9;
  ostream *poVar10;
  char *pcVar11;
  double dVar12;
  FT_Bool isCID;
  FT_Int supplement;
  char *ordering;
  FT_ULong length;
  FreeTypeFaceWrapper face;
  
  std::operator<<((ostream *)&std::cout,"Start Font\n");
  if (inSecondaryFontFilePath->_M_string_length == 0) {
    inFace = FreeTypeWrapper::NewFace(inFreeType,inFontFilePath,0);
  }
  else {
    inFace = FreeTypeWrapper::NewFace(inFreeType,inFontFilePath,inSecondaryFontFilePath,0);
  }
  if (inFace == (FT_Face)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Failed to load font from ");
    poVar6 = std::operator<<(poVar6,(inFontFilePath->_M_dataplus)._M_p);
    std::operator<<(poVar6,"\n");
    EVar9 = eFailure;
    goto LAB_00130941;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&length,"",(allocator<char> *)&ordering);
  FreeTypeFaceWrapper::FreeTypeFaceWrapper(&face,inFace,(string *)&length,0,false);
  std::__cxx11::string::~string((string *)&length);
  poVar6 = std::operator<<((ostream *)&std::cout,"Font Family = ");
  pFVar7 = FreeTypeFaceWrapper::operator->(&face);
  if (pFVar7->family_name == (FT_String *)0x0) {
    pcVar8 = "somefont";
  }
  else {
    pFVar7 = FreeTypeFaceWrapper::operator->(&face);
    pcVar8 = pFVar7->family_name;
  }
  poVar6 = std::operator<<(poVar6,pcVar8);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"Font Style = ");
  pFVar7 = FreeTypeFaceWrapper::operator->(&face);
  if (pFVar7->style_name == (FT_String *)0x0) {
    pcVar8 = "somestyle";
  }
  else {
    pFVar7 = FreeTypeFaceWrapper::operator->(&face);
    pcVar8 = pFVar7->style_name;
  }
  poVar6 = std::operator<<(poVar6,pcVar8);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"Font Format = ");
  pFVar7 = FreeTypeFaceWrapper::operator_cast_to_FT_FaceRec__(&face);
  pcVar8 = FT_Get_X11_Font_Format(pFVar7);
  poVar6 = std::operator<<(poVar6,pcVar8);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"Font CID Keyed (does not includes sfnts) = ");
  pFVar7 = FreeTypeFaceWrapper::operator->(&face);
  pcVar11 = "yes";
  pcVar8 = "yes";
  if (((uint)pFVar7->face_flags >> 0xc & 1) == 0) {
    pcVar8 = "no";
  }
  poVar6 = std::operator<<(poVar6,pcVar8);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"Font SFNT modeled = ");
  pFVar7 = FreeTypeFaceWrapper::operator->(&face);
  pcVar8 = "yes";
  if ((pFVar7->face_flags & 8) == 0) {
    pcVar8 = "no";
  }
  poVar6 = std::operator<<(poVar6,pcVar8);
  std::operator<<(poVar6,"\n");
  pFVar7 = FreeTypeFaceWrapper::operator->(&face);
  if ((pFVar7->face_flags & 8) != 0) {
    length = 0;
    pFVar7 = FreeTypeFaceWrapper::operator_cast_to_FT_FaceRec__(&face);
    FVar2 = FT_Load_Sfnt_Table(pFVar7,0x43464620,0,(FT_Byte *)0x0,&length);
    if (FVar2 == 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"CCF table found, length is ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6,"\n");
    }
  }
  pFVar7 = FreeTypeFaceWrapper::operator_cast_to_FT_FaceRec__(&face);
  FVar2 = FT_Get_CID_Is_Internally_CID_Keyed(pFVar7,&isCID);
  if (FVar2 == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Font Internally CID (checks also sfnts) = ");
    if (isCID == '\0') {
      pcVar11 = "no";
    }
    poVar6 = std::operator<<(poVar6,pcVar11);
    std::operator<<(poVar6,"\n");
    if (isCID == '\0') goto LAB_0013045d;
    pFVar7 = FreeTypeFaceWrapper::operator_cast_to_FT_FaceRec__(&face);
    FVar2 = FT_Get_CID_Registry_Ordering_Supplement(pFVar7,(char **)&length,&ordering,&supplement);
    if (FVar2 == 0) {
      EVar9 = eSuccess;
    }
    else {
      std::operator<<((ostream *)&std::cout,
                      "Failed to read registry, ordering and supplement informaiton\n");
      EVar9 = eFailure;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"CID Registry = ");
    poVar6 = std::operator<<(poVar6,(char *)length);
    std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"CID Ordering = ");
    poVar6 = std::operator<<(poVar6,ordering);
    std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"CID Supplement = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,supplement);
    std::operator<<(poVar6,"\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"No CID information to read\n");
    isCID = '\0';
LAB_0013045d:
    EVar9 = eSuccess;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Font BBox = [");
  FreeTypeFaceWrapper::operator->(&face);
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  poVar6 = std::operator<<(poVar6," ");
  FreeTypeFaceWrapper::operator->(&face);
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  poVar6 = std::operator<<(poVar6," ");
  FreeTypeFaceWrapper::operator->(&face);
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  poVar6 = std::operator<<(poVar6," ");
  FreeTypeFaceWrapper::operator->(&face);
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  std::operator<<(poVar6,"]\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"Ascent ");
  pFVar7 = FreeTypeFaceWrapper::operator->(&face);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pFVar7->ascender);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"Descent ");
  pFVar7 = FreeTypeFaceWrapper::operator->(&face);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pFVar7->descender);
  std::operator<<(poVar6,"\n");
  poVar10 = (ostream *)&std::cout;
  std::operator<<((ostream *)&std::cout,"Italic Angle = ");
  dVar12 = FreeTypeFaceWrapper::GetItalicAngle(&face);
  poVar6 = std::ostream::_M_insert<double>(dVar12);
  pcVar8 = "\n";
  std::operator<<(poVar6,"\n");
  BVar3 = FreeTypeFaceWrapper::GetCapHeight(&face);
  if (((uint)BVar3 & 1) == 0) {
    pcVar11 = "No Cap Height value\n";
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"Cap Height = ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar6,BVar3.second);
    pcVar11 = "\n";
  }
  std::operator<<(poVar10,pcVar11);
  BVar4 = FreeTypeFaceWrapper::GetxHeight(&face);
  if (((uint)BVar3 & 1) == 0) {
    pcVar8 = "No x Height value\n";
    poVar6 = (ostream *)&std::cout;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"x Height = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,BVar4.second);
  }
  std::operator<<(poVar6,pcVar8);
  poVar10 = (ostream *)&std::cout;
  poVar6 = std::operator<<((ostream *)&std::cout,"StemV = ");
  FVar1 = FreeTypeFaceWrapper::GetStemV(&face);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,FVar1);
  pcVar8 = "\n";
  std::operator<<(poVar6,"\n");
  EVar5 = FreeTypeFaceWrapper::GetFontStretch(&face);
  if (EVar5 == eFontStretchUknown) {
    pcVar8 = "Unkown Stretch";
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"Stretch = ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar6,EVar5);
  }
  std::operator<<(poVar10,pcVar8);
  FVar1 = FreeTypeFaceWrapper::GetFontWeight(&face);
  if (FVar1 == 1000) {
    pcVar8 = "Unknown Weight";
    poVar6 = (ostream *)&std::cout;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"Weight = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,FVar1);
    pcVar8 = "\n";
  }
  std::operator<<(poVar6,pcVar8);
  poVar6 = std::operator<<((ostream *)&std::cout,"FontFlags = ");
  FreeTypeFaceWrapper::GetFontFlags(&face);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,"\n");
  pFVar7 = FreeTypeFaceWrapper::operator->(&face);
  if ((pFVar7->face_flags & 0x200) == 0) {
    std::operator<<((ostream *)&std::cout,"Font does not have glyph names\n");
  }
  else {
    pFVar7 = FreeTypeFaceWrapper::operator_cast_to_FT_FaceRec__(&face);
    glyph_index = FT_Get_Char_Index(pFVar7,0x31);
    std::operator<<((ostream *)&std::cout,"Font has glyph names\n");
    if (glyph_index != 0) {
      pFVar7 = FreeTypeFaceWrapper::operator_cast_to_FT_FaceRec__(&face);
      FVar2 = FT_Get_Glyph_Name(pFVar7,glyph_index,&length,0x1f);
      if (FVar2 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Glyph name for the 1 = ");
        poVar6 = std::operator<<(poVar6,(char *)&length);
        std::operator<<(poVar6,"\n");
      }
    }
  }
  FreeTypeFaceWrapper::~FreeTypeFaceWrapper(&face);
LAB_00130941:
  FreeTypeWrapper::DoneFace(inFreeType,inFace);
  std::operator<<((ostream *)&std::cout,"End Font\n\n");
  return EVar9;
}

Assistant:

static EStatusCode ShowFaceProperties(FreeTypeWrapper& inFreeType,const string& inFontFilePath,const string& inSecondaryFontFilePath = "")
{
	FT_Face face;
	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		cout<<"Start Font\n";
		if(inSecondaryFontFilePath.length() > 0)
			face = inFreeType.NewFace(inFontFilePath,inSecondaryFontFilePath,0);
		else
			face = inFreeType.NewFace(inFontFilePath,0);
		if(!face)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to load font from "<<inFontFilePath.c_str()<<"\n";
			break;
		}
		status = ShowGlobalFontProperties(inFreeType,face);
	}
	while(false);

	inFreeType.DoneFace(face);
	cout<<"End Font\n\n";
	return status;
}